

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O3

string * tinyusdz::io::ExpandFilePath
                   (string *__return_storage_ptr__,string *_filepath,void *param_2)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  string s;
  string filepath;
  string quoted_path;
  wordexp_t p;
  allocator local_c9;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  wordexp_t local_48;
  
  pcVar1 = (_filepath->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + _filepath->_M_string_length);
  if (0x800 < local_a8._M_string_length) {
    std::__cxx11::string::resize((ulong)&local_a8,'\0');
  }
  local_c0 = 0;
  local_b8 = '\0';
  local_c8 = &local_b8;
  if (local_a8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::operator+(&local_68,"\"",&local_a8);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar2 = wordexp((char *)local_88,&local_48,4);
    if (iVar2 == 0) {
      if (local_48.we_wordv == (char **)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      else {
        std::__cxx11::string::string((string *)&local_68,*local_48.we_wordv,&local_c9);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        wordfree(&local_48);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_c8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    if (local_c8 == &local_b8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_b0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_c8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
    }
    __return_storage_ptr__->_M_string_length = local_c0;
    local_c0 = 0;
    local_b8 = '\0';
    local_c8 = &local_b8;
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandFilePath(const std::string &_filepath, void *) {
  std::string filepath = _filepath;
  if (filepath.size() > 2048) {
    // file path too large.
    // TODO: Report warn.
    filepath.resize(2048);
  }

#ifdef _WIN32
  // Assume input `filepath` is encoded in UTF-8
  std::wstring wfilepath = UTF8ToWchar(filepath);
  DWORD wlen = ExpandEnvironmentStringsW(wfilepath.c_str(), nullptr, 0);
  wchar_t *wstr = new wchar_t[wlen];
  ExpandEnvironmentStringsW(wfilepath.c_str(), wstr, wlen);

  std::wstring ws(wstr);
  delete[] wstr;
  return WcharToUTF8(ws);

#else

#if defined(TINYUSDZ_BUILD_IOS) || defined(TARGET_OS_IPHONE) || \
    defined(TARGET_IPHONE_SIMULATOR) || defined(__ANDROID__) || \
    defined(__EMSCRIPTEN__) || defined(__OpenBSD__) || defined(__wasi__)
  // no expansion
  std::string s = filepath;
#else
  std::string s;
  wordexp_t p;

  if (filepath.empty()) {
    return "";
  }

  // Quote the string to keep any spaces in filepath intact.
  std::string quoted_path = "\"" + filepath + "\"";
  // char** w;
  // TODO: wordexp() is a awful API. Implement our own file path expansion
  // routine. Set NOCMD for security.
  int ret = wordexp(quoted_path.c_str(), &p, WRDE_NOCMD);
  if (ret) {
    // err
    s = filepath;
    return s;
  }

  // Use first element only.
  if (p.we_wordv) {
    s = std::string(p.we_wordv[0]);
    wordfree(&p);
  } else {
    s = filepath;
  }

#endif

  return s;
#endif
}